

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

void luaG_runerror(lua_State *L,char *fmt,...)

{
  CallInfo *ci;
  lua_CFunction p_Var1;
  TString *src;
  char in_AL;
  int line;
  char *pcVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list argp;
  __va_list_tag local_f8;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  ci = L->ci;
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (0 < L->l_G->GCdebt) {
    luaC_step(L);
  }
  local_f8.reg_save_area = local_d8;
  local_f8.overflow_arg_area = &argp[0].overflow_arg_area;
  local_f8.gp_offset = 0x10;
  local_f8.fp_offset = 0x30;
  pcVar2 = luaO_pushvfstring(L,fmt,&local_f8);
  if ((ci->callstatus & 2) == 0) {
LAB_00128661:
    luaG_errormsg(L);
  }
  if (ci->func->tt_ == 0x8006) {
    p_Var1 = (ci->func->value_).f;
    if (p_Var1[8] == (_func_int_lua_State_ptr)0x6) {
      src = *(TString **)(*(long *)(p_Var1 + 0x18) + 0x68);
      line = currentline(ci);
      luaG_addinfo(L,pcVar2,src,line);
      goto LAB_00128661;
    }
    pcVar2 = "((((ci)->func)->value_).gc)->tt == ((6) | ((0) << 4))";
  }
  else {
    pcVar2 = "(((((ci)->func))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))";
  }
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                ,0x2c1,"void luaG_runerror(lua_State *, const char *, ...)");
}

Assistant:

l_noret luaG_runerror (lua_State *L, const char *fmt, ...) {
  CallInfo *ci = L->ci;
  const char *msg;
  va_list argp;
  luaC_checkGC(L);  /* error message uses memory */
  va_start(argp, fmt);
  msg = luaO_pushvfstring(L, fmt, argp);  /* format message */
  va_end(argp);
  if (isLua(ci))  /* if Lua function, add source:line information */
    luaG_addinfo(L, msg, ci_func(ci)->p->source, currentline(ci));
  luaG_errormsg(L);
}